

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

qreal __thiscall QTextEdit::fontPointSize(QTextEdit *this)

{
  long in_FS_OFFSET;
  qreal qVar1;
  QTextEditPrivate *d;
  QTextCursor *this_00;
  QTextCursor local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QTextEdit *)0x6d1345);
  this_00 = local_20;
  QWidgetTextControl::textCursor((QWidgetTextControl *)this_00);
  QTextCursor::charFormat();
  qVar1 = QTextCharFormat::fontPointSize((QTextCharFormat *)0x6d1381);
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x6d1390);
  QTextCursor::~QTextCursor(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return qVar1;
  }
  __stack_chk_fail();
}

Assistant:

qreal QTextEdit::fontPointSize() const
{
    Q_D(const QTextEdit);
    return d->control->textCursor().charFormat().fontPointSize();
}